

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool flatbuffers::StringToNumber<signed_char>(char *s,char *val)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  longlong lVar4;
  long lVar5;
  int __base;
  char cVar6;
  char *endptr;
  char *local_20;
  
  if ((s == (char *)0x0) || (pbVar3 = (byte *)s, val == (char *)0x0)) {
    __assert_fail("s && val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x14b,"bool flatbuffers::StringToNumber(const char *, T *) [T = signed char]");
  }
  do {
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    if (bVar1 == 0) break;
  } while (9 < (int)(char)bVar1 - 0x30U);
  if ((bVar1 == 0x30) && ((*pbVar3 & 0xdf) == 0x58)) {
    __base = 0x10;
  }
  else {
    __base = 10;
  }
  local_20 = s;
  lVar4 = strtoll_l(s,&local_20,__base,ClassicLocale::instance_);
  lVar5 = 0;
  if (local_20 != s && *local_20 == '\0') {
    lVar5 = lVar4;
  }
  cVar6 = '\0';
  bVar2 = false;
  if (local_20 != s && *local_20 == '\0') {
    if (lVar5 < 0x80) {
      bVar2 = -0x81 < lVar5;
      cVar6 = -0x80;
      if (-0x80 < lVar5) {
        cVar6 = (char)lVar5;
      }
    }
    else {
      cVar6 = '\x7f';
      bVar2 = false;
    }
  }
  *val = cVar6;
  return bVar2;
}

Assistant:

inline bool StringToNumber(const char *s, T *val) {
  // Assert on `unsigned long` and `signed long` on LP64.
  // If it is necessary, it could be solved with flatbuffers::enable_if<B,T>.
  static_assert(sizeof(T) < sizeof(int64_t), "unexpected type T");
  FLATBUFFERS_ASSERT(s && val);
  int64_t i64;
  // The errno check isn't needed, will return MAX/MIN on overflow.
  if (StringToIntegerImpl(&i64, s, 0, false)) {
    const int64_t max = (flatbuffers::numeric_limits<T>::max)();
    const int64_t min = flatbuffers::numeric_limits<T>::lowest();
    if (i64 > max) {
      *val = static_cast<T>(max);
      return false;
    }
    if (i64 < min) {
      // For unsigned types return max to distinguish from
      // "no conversion can be performed" when 0 is returned.
      *val = static_cast<T>(flatbuffers::is_unsigned<T>::value ? max : min);
      return false;
    }
    *val = static_cast<T>(i64);
    return true;
  }
  *val = 0;
  return false;
}